

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Reader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::BP3Reader::PerformGets(BP3Reader *this)

{
  _Rb_tree_node_base *name;
  BP3Deserializer *this_00;
  long lVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  DataType DVar7;
  int iVar8;
  Variable<unsigned_char> *variable;
  Variable<std::complex<float>_> *variable_00;
  Variable<std::complex<double>_> *variable_01;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable_02;
  Variable<long_double> *variable_03;
  Variable<float> *variable_04;
  _Rb_tree_node_base *p_Var9;
  BPInfo *blockInfo;
  pointer pBVar10;
  pointer pBVar11;
  pointer pBVar12;
  pointer pBVar13;
  pointer pBVar14;
  pointer pBVar15;
  pointer pBVar16;
  pointer this_01;
  pointer pBVar17;
  pointer pBVar18;
  pointer this_02;
  pointer this_03;
  pointer pBVar19;
  pointer pBVar20;
  pointer pBVar21;
  ScopedTimer __var2110;
  ScopedTimer local_220;
  _Rb_tree_node_base *local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((PerformGets()::__var110 == '\0') &&
     (iVar8 = __cxa_guard_acquire(&PerformGets()::__var110), iVar8 != 0)) {
    PerformGets::__var110 = (void *)ps_timer_create_("BP3Reader::PerformGets");
    __cxa_guard_release(&PerformGets()::__var110);
  }
  local_220.m_timer = PerformGets::__var110;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  lVar1 = *(long *)(*(long *)&this->m_BP3Deserializer + -0x18);
  if (*(long *)(&(this->m_BP3Deserializer).field_0x390 + lVar1) != 0) {
    this_00 = &this->m_BP3Deserializer;
    p_Var9 = *(_Rb_tree_node_base **)(&(this->m_BP3Deserializer).field_0x380 + lVar1);
    local_218 = (_Rb_tree_node_base *)(&(this->m_BP3Deserializer).field_0x370 + lVar1);
    if (p_Var9 != local_218) {
      do {
        name = p_Var9 + 1;
        DVar7 = IO::InquireVariableType((this->super_Engine).m_IO,(string *)name);
        switch(DVar7) {
        case Int8:
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"in call to PerformGets, EndStep or Close","");
          variable = (Variable<unsigned_char> *)
                     Engine::FindVariable<signed_char>(&this->super_Engine,(string *)name,&local_90)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          pBVar2 = (((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                      *)&variable->m_BlocksInfo)->
                   super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar12 = (((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                            *)&variable->m_BlocksInfo)->
                         super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                         )._M_impl.super__Vector_impl_data._M_start; pBVar12 != pBVar2;
              pBVar12 = pBVar12 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<signed_char>
                      (this_00,(Variable<signed_char> *)variable,(BPInfo *)pBVar12);
          }
          ReadVariableBlocks<signed_char>(this,(Variable<signed_char> *)variable);
          pBVar21 = (pointer)(((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                                *)&variable->m_BlocksInfo)->
                             super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start;
          pBVar13 = (pointer)(((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                                *)&variable->m_BlocksInfo)->
                             super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
          pBVar18 = pBVar21;
          if (pBVar13 != pBVar21) {
            do {
              Variable<signed_char>::BPInfo::~BPInfo((BPInfo *)pBVar18);
              pBVar18 = pBVar18 + 1;
            } while (pBVar18 != pBVar13);
LAB_0042c1cc:
            (((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
               *)&variable->m_BlocksInfo)->
            super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
            )._M_impl.super__Vector_impl_data._M_finish = (pointer)pBVar21;
          }
          break;
        case Int16:
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"in call to PerformGets, EndStep or Close","");
          variable = (Variable<unsigned_char> *)
                     Engine::FindVariable<short>(&this->super_Engine,(string *)name,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          pBVar2 = (((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                      *)&variable->m_BlocksInfo)->
                   super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar12 = (((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                            *)&variable->m_BlocksInfo)->
                         super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                         )._M_impl.super__Vector_impl_data._M_start; pBVar12 != pBVar2;
              pBVar12 = pBVar12 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<short>
                      (this_00,(Variable<short> *)variable,(BPInfo *)pBVar12);
          }
          ReadVariableBlocks<short>(this,(Variable<short> *)variable);
          pBVar21 = (pointer)(((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                                *)&variable->m_BlocksInfo)->
                             super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start;
          pBVar13 = (pointer)(((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                                *)&variable->m_BlocksInfo)->
                             super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
          pBVar18 = pBVar21;
          if (pBVar13 != pBVar21) {
            do {
              Variable<short>::BPInfo::~BPInfo((BPInfo *)pBVar18);
              pBVar18 = pBVar18 + 1;
            } while (pBVar18 != pBVar13);
            goto LAB_0042c1cc;
          }
          break;
        case Int32:
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"in call to PerformGets, EndStep or Close","");
          variable_04 = (Variable<float> *)
                        Engine::FindVariable<int>(&this->super_Engine,(string *)name,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          pBVar6 = (variable_04->m_BlocksInfo).
                   super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar16 = (variable_04->m_BlocksInfo).
                         super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar16 != pBVar6;
              pBVar16 = pBVar16 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<int>
                      (this_00,(Variable<int> *)variable_04,(BPInfo *)pBVar16);
          }
          ReadVariableBlocks<int>(this,(Variable<int> *)variable_04);
          pBVar16 = (variable_04->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar6 = (variable_04->m_BlocksInfo).
                   super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pBVar19 = pBVar16;
          if (pBVar6 != pBVar16) {
            do {
              Variable<int>::BPInfo::~BPInfo((BPInfo *)pBVar19);
              pBVar19 = pBVar19 + 1;
            } while (pBVar19 != pBVar6);
LAB_0042c2cb:
            (variable_04->m_BlocksInfo).
            super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = pBVar16;
          }
          break;
        case Int64:
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"in call to PerformGets, EndStep or Close","");
          variable_00 = (Variable<std::complex<float>_> *)
                        Engine::FindVariable<long>(&this->super_Engine,(string *)name,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          pBVar20 = (variable_00->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar11 = (variable_00->m_BlocksInfo).
                         super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar11 != pBVar20;
              pBVar11 = pBVar11 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<long>
                      (this_00,(Variable<long> *)variable_00,(BPInfo *)pBVar11);
          }
          ReadVariableBlocks<long>(this,(Variable<long> *)variable_00);
          pBVar20 = (variable_00->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar11 = (variable_00->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pBVar17 = pBVar20;
          if (pBVar11 != pBVar20) {
            do {
              Variable<long>::BPInfo::~BPInfo((BPInfo *)pBVar17);
              pBVar17 = pBVar17 + 1;
            } while (pBVar17 != pBVar11);
LAB_0042c111:
            (variable_00->m_BlocksInfo).
            super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = pBVar20;
          }
          break;
        case UInt8:
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"in call to PerformGets, EndStep or Close","");
          variable = Engine::FindVariable<unsigned_char>
                               (&this->super_Engine,(string *)name,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          pBVar21 = (variable->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar13 = (variable->m_BlocksInfo).
                         super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar13 != pBVar21;
              pBVar13 = pBVar13 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<unsigned_char>
                      (this_00,variable,pBVar13);
          }
          ReadVariableBlocks<unsigned_char>(this,variable);
          pBVar21 = (variable->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar13 = (variable->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pBVar18 = pBVar21;
          if (pBVar13 != pBVar21) {
            do {
              Variable<unsigned_char>::BPInfo::~BPInfo(pBVar18);
              pBVar18 = pBVar18 + 1;
            } while (pBVar18 != pBVar13);
            goto LAB_0042c1cc;
          }
          break;
        case UInt16:
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,"in call to PerformGets, EndStep or Close","");
          variable = (Variable<unsigned_char> *)
                     Engine::FindVariable<unsigned_short>
                               (&this->super_Engine,(string *)name,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          pBVar21 = (variable->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar13 = (variable->m_BlocksInfo).
                         super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar13 != pBVar21;
              pBVar13 = pBVar13 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<unsigned_short>
                      (this_00,(Variable<unsigned_short> *)variable,(BPInfo *)pBVar13);
          }
          ReadVariableBlocks<unsigned_short>(this,(Variable<unsigned_short> *)variable);
          pBVar21 = (variable->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar13 = (variable->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pBVar18 = pBVar21;
          if (pBVar13 != pBVar21) {
            do {
              Variable<unsigned_short>::BPInfo::~BPInfo((BPInfo *)pBVar18);
              pBVar18 = pBVar18 + 1;
            } while (pBVar18 != pBVar13);
            goto LAB_0042c1cc;
          }
          break;
        case UInt32:
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_150,"in call to PerformGets, EndStep or Close","");
          variable_04 = (Variable<float> *)
                        Engine::FindVariable<unsigned_int>
                                  (&this->super_Engine,(string *)name,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          pBVar6 = (variable_04->m_BlocksInfo).
                   super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar16 = (variable_04->m_BlocksInfo).
                         super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar16 != pBVar6;
              pBVar16 = pBVar16 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<unsigned_int>
                      (this_00,(Variable<unsigned_int> *)variable_04,(BPInfo *)pBVar16);
          }
          ReadVariableBlocks<unsigned_int>(this,(Variable<unsigned_int> *)variable_04);
          pBVar16 = (variable_04->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar6 = (variable_04->m_BlocksInfo).
                   super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pBVar19 = pBVar16;
          if (pBVar6 != pBVar16) {
            do {
              Variable<unsigned_int>::BPInfo::~BPInfo((BPInfo *)pBVar19);
              pBVar19 = pBVar19 + 1;
            } while (pBVar19 != pBVar6);
            goto LAB_0042c2cb;
          }
          break;
        case UInt64:
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,"in call to PerformGets, EndStep or Close","");
          variable_00 = (Variable<std::complex<float>_> *)
                        Engine::FindVariable<unsigned_long>
                                  (&this->super_Engine,(string *)name,&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          pBVar20 = (variable_00->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar11 = (variable_00->m_BlocksInfo).
                         super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar11 != pBVar20;
              pBVar11 = pBVar11 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<unsigned_long>
                      (this_00,(Variable<unsigned_long> *)variable_00,(BPInfo *)pBVar11);
          }
          ReadVariableBlocks<unsigned_long>(this,(Variable<unsigned_long> *)variable_00);
          pBVar20 = (variable_00->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar11 = (variable_00->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pBVar17 = pBVar20;
          if (pBVar11 != pBVar20) {
            do {
              Variable<unsigned_long>::BPInfo::~BPInfo((BPInfo *)pBVar17);
              pBVar17 = pBVar17 + 1;
            } while (pBVar17 != pBVar11);
            goto LAB_0042c111;
          }
          break;
        case Float:
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_190,"in call to PerformGets, EndStep or Close","");
          variable_04 = Engine::FindVariable<float>(&this->super_Engine,(string *)name,&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p);
          }
          pBVar6 = (variable_04->m_BlocksInfo).
                   super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar16 = (variable_04->m_BlocksInfo).
                         super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar16 != pBVar6;
              pBVar16 = pBVar16 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<float>
                      (this_00,variable_04,pBVar16);
          }
          ReadVariableBlocks<float>(this,variable_04);
          pBVar16 = (variable_04->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar6 = (variable_04->m_BlocksInfo).
                   super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pBVar19 = pBVar16;
          if (pBVar6 != pBVar16) {
            do {
              Variable<float>::BPInfo::~BPInfo(pBVar19);
              pBVar19 = pBVar19 + 1;
            } while (pBVar19 != pBVar6);
            goto LAB_0042c2cb;
          }
          break;
        case Double:
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"in call to PerformGets, EndStep or Close","");
          variable_00 = (Variable<std::complex<float>_> *)
                        Engine::FindVariable<double>(&this->super_Engine,(string *)name,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p);
          }
          pBVar20 = (variable_00->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar11 = (variable_00->m_BlocksInfo).
                         super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar11 != pBVar20;
              pBVar11 = pBVar11 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<double>
                      (this_00,(Variable<double> *)variable_00,(BPInfo *)pBVar11);
          }
          ReadVariableBlocks<double>(this,(Variable<double> *)variable_00);
          pBVar20 = (variable_00->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar11 = (variable_00->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pBVar17 = pBVar20;
          if (pBVar11 != pBVar20) {
            do {
              Variable<double>::BPInfo::~BPInfo((BPInfo *)pBVar17);
              pBVar17 = pBVar17 + 1;
            } while (pBVar17 != pBVar11);
            goto LAB_0042c111;
          }
          break;
        case LongDouble:
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"in call to PerformGets, EndStep or Close","");
          variable_03 = Engine::FindVariable<long_double>
                                  (&this->super_Engine,(string *)name,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p);
          }
          pBVar5 = (variable_03->m_BlocksInfo).
                   super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar15 = (variable_03->m_BlocksInfo).
                         super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar15 != pBVar5;
              pBVar15 = pBVar15 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<long_double>
                      (this_00,variable_03,pBVar15);
          }
          ReadVariableBlocks<long_double>(this,variable_03);
          pBVar15 = (variable_03->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar5 = (variable_03->m_BlocksInfo).
                   super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          this_03 = pBVar15;
          if (pBVar5 != pBVar15) {
            do {
              Variable<long_double>::BPInfo::~BPInfo(this_03);
              this_03 = this_03 + 1;
            } while (this_03 != pBVar5);
            (variable_03->m_BlocksInfo).
            super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = pBVar15;
          }
          break;
        case FloatComplex:
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f0,"in call to PerformGets, EndStep or Close","");
          variable_00 = Engine::FindVariable<std::complex<float>>
                                  (&this->super_Engine,(string *)name,&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          pBVar20 = (variable_00->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar11 = (variable_00->m_BlocksInfo).
                         super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar11 != pBVar20;
              pBVar11 = pBVar11 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<std::complex<float>>
                      (this_00,variable_00,pBVar11);
          }
          ReadVariableBlocks<std::complex<float>>(this,variable_00);
          pBVar20 = (variable_00->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar11 = (variable_00->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pBVar17 = pBVar20;
          if (pBVar11 != pBVar20) {
            do {
              Variable<std::complex<float>_>::BPInfo::~BPInfo(pBVar17);
              pBVar17 = pBVar17 + 1;
            } while (pBVar17 != pBVar11);
            goto LAB_0042c111;
          }
          break;
        case DoubleComplex:
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_210,"in call to PerformGets, EndStep or Close","");
          variable_01 = Engine::FindVariable<std::complex<double>>
                                  (&this->super_Engine,(string *)name,&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p);
          }
          pBVar3 = (variable_01->m_BlocksInfo).
                   super__Vector_base<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar10 = (variable_01->m_BlocksInfo).
                         super__Vector_base<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar10 != pBVar3;
              pBVar10 = pBVar10 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<std::complex<double>>
                      (this_00,variable_01,pBVar10);
          }
          ReadVariableBlocks<std::complex<double>>(this,variable_01);
          pBVar10 = (variable_01->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar3 = (variable_01->m_BlocksInfo).
                   super__Vector_base<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          this_01 = pBVar10;
          if (pBVar3 != pBVar10) {
            do {
              Variable<std::complex<double>_>::BPInfo::~BPInfo(this_01);
              this_01 = this_01 + 1;
            } while (this_01 != pBVar3);
            (variable_01->m_BlocksInfo).
            super__Vector_base<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = pBVar10;
          }
          break;
        case String:
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"in call to PerformGets, EndStep or Close","");
          variable_02 = Engine::FindVariable<std::__cxx11::string>
                                  (&this->super_Engine,(string *)name,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          pBVar4 = (variable_02->m_BlocksInfo).
                   super__Vector_base<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar14 = (variable_02->m_BlocksInfo).
                         super__Vector_base<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar14 != pBVar4;
              pBVar14 = pBVar14 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<std::__cxx11::string>
                      (this_00,variable_02,pBVar14);
          }
          ReadVariableBlocks<std::__cxx11::string>(this,variable_02);
          pBVar14 = (variable_02->m_BlocksInfo).
                    super__Vector_base<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar4 = (variable_02->m_BlocksInfo).
                   super__Vector_base<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          this_02 = pBVar14;
          if (pBVar4 != pBVar14) {
            do {
              Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::BPInfo::~BPInfo(this_02);
              this_02 = this_02 + 1;
            } while (this_02 != pBVar4);
            (variable_02->m_BlocksInfo).
            super__Vector_base<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = pBVar14;
          }
          break;
        case Char:
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"in call to PerformGets, EndStep or Close","");
          variable = (Variable<unsigned_char> *)
                     Engine::FindVariable<char>(&this->super_Engine,(string *)name,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          pBVar2 = (((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                      *)&variable->m_BlocksInfo)->
                   super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar12 = (((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                            *)&variable->m_BlocksInfo)->
                         super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                         )._M_impl.super__Vector_impl_data._M_start; pBVar12 != pBVar2;
              pBVar12 = pBVar12 + 1) {
            adios2::format::BP3Deserializer::SetVariableBlockInfo<char>
                      (this_00,(Variable<char> *)variable,pBVar12);
          }
          ReadVariableBlocks<char>(this,(Variable<char> *)variable);
          pBVar21 = (pointer)(((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                                *)&variable->m_BlocksInfo)->
                             super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start;
          pBVar13 = (pointer)(((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                                *)&variable->m_BlocksInfo)->
                             super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
          pBVar18 = pBVar21;
          if (pBVar13 != pBVar21) {
            do {
              Variable<char>::BPInfo::~BPInfo((BPInfo *)pBVar18);
              pBVar18 = pBVar18 + 1;
            } while (pBVar18 != pBVar13);
            goto LAB_0042c1cc;
          }
        }
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != local_218);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(&this_00->field_0x368 + *(long *)(*(long *)this_00 + -0x18)));
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_220);
  return;
}

Assistant:

void BP3Reader::PerformGets()
{
    PERFSTUBS_SCOPED_TIMER("BP3Reader::PerformGets");
    if (m_BP3Deserializer.m_DeferredVariables.empty())
    {
        return;
    }

    for (const std::string &name : m_BP3Deserializer.m_DeferredVariables)
    {
        const DataType type = m_IO.InquireVariableType(name);

        if (type == DataType::Struct)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> &variable = FindVariable<T>(name, "in call to PerformGets, EndStep or Close"); \
        for (auto &blockInfo : variable.m_BlocksInfo)                                              \
        {                                                                                          \
            m_BP3Deserializer.SetVariableBlockInfo(variable, blockInfo);                           \
        }                                                                                          \
        ReadVariableBlocks(variable);                                                              \
        variable.m_BlocksInfo.clear();                                                             \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    }

    m_BP3Deserializer.m_DeferredVariables.clear();
}